

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O1

int array_bitset_container_intersection_cardinality
              (array_container_t *src_1,bitset_container_t *src_2)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)src_1->cardinality) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)((src_2->words[src_1->array[lVar2] >> 6] >>
                              ((ulong)src_1->array[lVar2] & 0x3f) & 1) != 0);
      lVar2 = lVar2 + 1;
    } while (src_1->cardinality != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int array_bitset_container_intersection_cardinality(
    const array_container_t *src_1, const bitset_container_t *src_2) {
    int32_t newcard = 0;
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        newcard += bitset_container_contains(src_2, key);
    }
    return newcard;
}